

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts.c
# Opt level: O0

int uts_numChildren(Node *parent)

{
  uint uVar1;
  double dVar2;
  uint local_14;
  int rootBF;
  int numChildren;
  Node *parent_local;
  
  local_14 = 0;
  switch(type) {
  case BIN:
    if (parent->height == 0) {
      dVar2 = floor(b_0);
      local_14 = (uint)dVar2;
    }
    else {
      local_14 = uts_numChildren_bin(parent);
    }
    break;
  case GEO:
    local_14 = uts_numChildren_geo(parent);
    break;
  case HYBRID:
    if (shiftDepth * (double)gen_mx <= (double)parent->height) {
      local_14 = uts_numChildren_bin(parent);
    }
    else {
      local_14 = uts_numChildren_geo(parent);
    }
    break;
  case BALANCED:
    if (parent->height < gen_mx) {
      local_14 = (uint)b_0;
    }
    break;
  default:
    uts_error("parTreeSearch(): Unknown tree type");
  }
  if ((parent->height == 0) && (parent->type == 0)) {
    dVar2 = ceil(b_0);
    uVar1 = (uint)dVar2;
    if ((int)uVar1 < (int)local_14) {
      printf("*** Number of children of root truncated from %d to %d\n",(ulong)local_14,(ulong)uVar1
            );
      local_14 = uVar1;
    }
  }
  else if ((type != BALANCED) && (100 < (int)local_14)) {
    printf("*** Number of children truncated from %d to %d\n",(ulong)local_14,100);
    local_14 = 100;
  }
  return local_14;
}

Assistant:

int uts_numChildren(Node *parent) {
  int numChildren = 0;

  /* Determine the number of children */
  switch (type) {
    case BIN:
      if (parent->height == 0)
        numChildren = (int) floor(b_0);
      else 
        numChildren = uts_numChildren_bin(parent);
      break;
  
    case GEO:
      numChildren = uts_numChildren_geo(parent);
      break;
    
    case HYBRID:
      if (parent->height < shiftDepth * gen_mx)
        numChildren = uts_numChildren_geo(parent);
      else
        numChildren = uts_numChildren_bin(parent);
      break;
    case BALANCED:
      if (parent->height < gen_mx)
        numChildren = (int) b_0;
      break;
    default:
      uts_error("parTreeSearch(): Unknown tree type");
  }
  
  // limit number of children
  // only a BIN root can have more than MAXNUMCHILDREN
  if (parent->height == 0 && parent->type == BIN) {
    int rootBF = (int) ceil(b_0);
    if (numChildren > rootBF) {
      printf("*** Number of children of root truncated from %d to %d\n",
             numChildren, rootBF);
      numChildren = rootBF;
    }
  }
  else if (type != BALANCED) {
    if (numChildren > MAXNUMCHILDREN) {
      printf("*** Number of children truncated from %d to %d\n", 
             numChildren, MAXNUMCHILDREN);
      numChildren = MAXNUMCHILDREN;
    }
  }

  return numChildren;
}